

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_listener_base.cpp
# Opt level: O0

int __thiscall zmq::stream_listener_base_t::close(stream_listener_base_t *this,int __fd)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  char *errstr;
  int rc;
  endpoint_uri_pair_t *this_00;
  socket_base_t *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffffc8;
  
  if (this->_s == -1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_s != retired_fd",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_listener_base.cpp"
            ,0x56);
    fflush(_stderr);
    zmq_abort((char *)0x22307a);
  }
  iVar1 = ::close(this->_s);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_listener_base.cpp"
            ,0x5c);
    fflush(_stderr);
    zmq_abort((char *)0x2230f4);
  }
  this_00 = (endpoint_uri_pair_t *)&stack0xffffffffffffffa0;
  make_unconnected_bind_endpoint_pair(in_stack_ffffffffffffffc8);
  socket_base_t::event_closed
            (in_stack_ffffffffffffff90,(endpoint_uri_pair_t *)this,(fd_t)((ulong)this_00 >> 0x20));
  endpoint_uri_pair_t::~endpoint_uri_pair_t(this_00);
  this->_s = -1;
  return 0;
}

Assistant:

int zmq::stream_listener_base_t::close ()
{
    // TODO this is identical to stream_connector_base_t::close

    zmq_assert (_s != retired_fd);
#ifdef ZMQ_HAVE_WINDOWS
    const int rc = closesocket (_s);
    wsa_assert (rc != SOCKET_ERROR);
#else
    const int rc = ::close (_s);
    errno_assert (rc == 0);
#endif
    _socket->event_closed (make_unconnected_bind_endpoint_pair (_endpoint), _s);
    _s = retired_fd;

    return 0;
}